

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O0

void xml_show_incomplete(TestReporter *reporter,char *filename,int line,char *message,
                        __va_list_tag *arguments)

{
  undefined8 uVar1;
  xmlChar *pxVar2;
  xmlNodePtr node;
  long in_RCX;
  uint in_EDX;
  char *in_RSI;
  xmlChar *xml_filename;
  xmlNodePtr locNode;
  xmlChar *xml_msg;
  xmlNodePtr errNode;
  xml_suite_context *ctx;
  __va_list_tag *in_stack_00000068;
  char *in_stack_00000070;
  
  uVar1 = xmlNewChild(context_stack[context_stack_p + -1].curTest,0,"error");
  xmlNewProp(uVar1,"type","Fatal");
  if (in_RCX == 0) {
    xmlNewProp(uVar1,"message",
               "Test terminated unexpectedly, likely from a non-standard exception or Posix signal")
    ;
  }
  else {
    pxVar2 = xml_secure_vprint(in_stack_00000070,in_stack_00000068);
    xmlNewProp(uVar1,"message",pxVar2);
    (*_xmlFree)(pxVar2);
  }
  node = (xmlNodePtr)xmlNewChild(uVar1,0,"location");
  pxVar2 = xmlEscapePropValue(in_RSI);
  xmlNewProp(node,"file",pxVar2);
  (*_xmlFree)(pxVar2);
  xmlFormatProp(node,(xmlChar *)"line","%d",(ulong)in_EDX);
  return;
}

Assistant:

static void xml_show_incomplete(TestReporter *reporter, const char *filename,
                                int line, const char *message, va_list arguments) {
    (void)reporter;

    struct xml_suite_context *ctx = &context_stack[context_stack_p-1];

    xmlNodePtr errNode = xmlNewChild(ctx->curTest, NULL, XMLSTRING("error"), NULL);
    xmlNewProp(errNode, XMLSTRING("type"), XMLSTRING("Fatal"));
    if (message) {
        xmlChar *xml_msg = xml_secure_vprint(message, arguments);
        xmlNewProp(errNode, XMLSTRING("message"), xml_msg);
        xmlFree(xml_msg);
    } else {
        xmlNewProp(errNode, XMLSTRING("message"),
                   XMLSTRING("Test terminated unexpectedly, likely from a non-standard exception or Posix signal"));
    }
    xmlNodePtr locNode = xmlNewChild(errNode, NULL, XMLSTRING("location"), NULL);
    xmlChar *xml_filename = xmlEscapePropValue(filename);
    xmlNewProp(locNode, XMLSTRING("file"), xml_filename);
    xmlFree(xml_filename);
    xmlFormatProp(locNode, XMLSTRING("line"), "%d", line);
}